

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_DeletedKey_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_DeletedKey_Test<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  iterator iVar1;
  int iVar2;
  pointer piVar3;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  pair<google::sparse_hashtable_iterator<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_70;
  
  local_80._M_head_impl._0_4_ = UniqueObjectHelper<int>(10);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_70,this_00,(const_reference)&local_80);
  local_80._M_head_impl._0_4_ = UniqueObjectHelper<int>(0x14);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(this_00,1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert_noresize(&local_70,this_00,(const_reference)&local_80);
  iVar2 = UniqueObjectHelper<int>(1);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x2a)
       = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar2;
  local_80._M_head_impl._0_4_ = -iVar2;
  local_78.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_78.data_._0_4_ = -(int)local_78.data_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_70,"this->ht_.deleted_key()","this->UniqueKey(1)",(int *)&local_80,
             (int *)&local_78);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar3 = (pointer)0xafc493;
    }
    else {
      piVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3f6,(char *)piVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_70.first.pos.row_begin._M_current)->group !=
        &((local_70.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_78.data_._0_4_ = 2;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (*(size_type *)
         ((long)&(this->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.table.settings + 0x18) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"2u","this->ht_.size()",(uint *)&local_78,
             (unsigned_long *)&local_80);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar3 = (pointer)0xafc493;
    }
    else {
      piVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3f7,(char *)piVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_70.first.pos.row_begin._M_current)->group !=
        &((local_70.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_70.first.ht._0_4_ = UniqueObjectHelper<int>(0x14);
  local_70.first.ht._0_4_ = -(int)local_70.first.ht;
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_00,(key_type *)&local_70);
  local_78.data_._0_4_ = 1;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (*(size_type *)
         ((long)&(this->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.table.settings + 0x18) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"1u","this->ht_.size()",(uint *)&local_78,
             (unsigned_long *)&local_80);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar3 = (pointer)0xafc493;
    }
    else {
      piVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3f9,(char *)piVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_70.first.pos.row_begin._M_current)->group !=
        &((local_70.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  iVar2 = UniqueObjectHelper<int>(2);
  google::
  sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 0x2a)
       = true;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar2;
  local_80._M_head_impl._0_4_ = -iVar2;
  local_78.data_._0_4_ = UniqueObjectHelper<int>(2);
  local_78.data_._0_4_ = -(int)local_78.data_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_70,"this->ht_.deleted_key()","this->UniqueKey(2)",(int *)&local_80,
             (int *)&local_78);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar3 = (pointer)0xafc493;
    }
    else {
      piVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3fd,(char *)piVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  iVar1._M_current = local_70.first.pos.row_begin._M_current;
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_70.first.pos.row_begin._M_current)->group !=
        &((local_70.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(iVar1._M_current);
  }
  local_78.data_._0_4_ = 1;
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (*(size_type *)
         ((long)&(this->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.table.settings + 0x18) -
       (this->
       super_HashtableAllTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_70,"1u","this->ht_.size()",(uint *)&local_78,
             (unsigned_long *)&local_80);
  if ((char)local_70.first.ht == '\0') {
    testing::Message::Message((Message *)&local_80);
    if (local_70.first.pos.row_begin._M_current ==
        (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
        0x0) {
      piVar3 = (pointer)0xafc493;
    }
    else {
      piVar3 = (local_70.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x3fe,(char *)piVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_70.first.pos.row_begin._M_current !=
      (sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *)
      0x0) {
    if ((int **)(local_70.first.pos.row_begin._M_current)->group !=
        &((local_70.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<int,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<int,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_70.first.pos.row_begin._M_current)->group);
    }
    operator_delete(local_70.first.pos.row_begin._M_current);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, DeletedKey) {
  if (!this->ht_.supports_deleted_key()) return;
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(1));
  EXPECT_EQ(2u, this->ht_.size());
  this->ht_.erase(this->UniqueKey(20));
  EXPECT_EQ(1u, this->ht_.size());

  // Changing the deleted key is fine.
  this->ht_.set_deleted_key(this->UniqueKey(2));
  EXPECT_EQ(this->ht_.deleted_key(), this->UniqueKey(2));
  EXPECT_EQ(1u, this->ht_.size());
}